

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_impls.cxx
# Opt level: O0

void __thiscall test_rpc_client::~test_rpc_client(test_rpc_client *this)

{
  test_rpc_client *in_RDI;
  
  ~test_rpc_client(in_RDI);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

test_rpc_client(msg_bus& bus, const std::string& port) : bus_(bus), port_(port)
    {
    }